

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
rehash(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *this,
      size_t sizeHint)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *pNVar7;
  ulong uVar8;
  ulong uVar9;
  size_t index;
  long lVar10;
  size_t numBuckets;
  Span *pSVar11;
  long lVar12;
  R RVar13;
  Bucket BVar14;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar10 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar13 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar13.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar3) {
    uVar8 = 0;
    pSVar11 = pSVar4;
    do {
      lVar10 = 0;
      do {
        bVar2 = pSVar11->offsets[lVar10];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar8].entries;
          uVar9 = *(ulong *)pEVar5[bVar2].storage.data;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          BVar14 = Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>>::
                   findBucketWithHash<QNetworkReply*>
                             ((Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>>
                               *)this,(QNetworkReply **)(pEVar5 + bVar2),
                              uVar9 >> 0x20 ^ this->seed ^ uVar9);
          pNVar7 = Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                   ::insert(BVar14.span,BVar14.index);
          pDVar6 = *(Data **)(pEVar5[bVar2].storage.data + 8);
          pNVar7->key = *(QNetworkReply **)pEVar5[bVar2].storage.data;
          (pNVar7->value).contextObject.wp.d = pDVar6;
          (pNVar7->value).contextObject.wp.value = *(QObject **)(pEVar5[bVar2].storage.data + 0x10);
          puVar1 = pEVar5[bVar2].storage.data + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          (pNVar7->value).slot.obj._M_t.
          super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
          _M_t.
          super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
          super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
               *(QSlotObjectBase **)(pEVar5[bVar2].storage.data + 0x18);
          pEVar5 = pEVar5 + bVar2;
          (pEVar5->storage).data[0x18] = '\0';
          (pEVar5->storage).data[0x19] = '\0';
          (pEVar5->storage).data[0x1a] = '\0';
          (pEVar5->storage).data[0x1b] = '\0';
          (pEVar5->storage).data[0x1c] = '\0';
          (pEVar5->storage).data[0x1d] = '\0';
          (pEVar5->storage).data[0x1e] = '\0';
          (pEVar5->storage).data[0x1f] = '\0';
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::freeData
                (pSVar4 + uVar8);
      uVar8 = uVar8 + 1;
      pSVar11 = pSVar11 + 1;
    } while (uVar8 != uVar3 >> 7);
  }
  if (pSVar4 != (Span *)0x0) {
    lVar10 = *(long *)&pSVar4[-1].allocated;
    if (lVar10 != 0) {
      lVar12 = lVar10 * 0x90;
      do {
        Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::freeData
                  ((Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                    *)(pSVar4[-1].offsets + lVar12));
        lVar12 = lVar12 + -0x90;
      } while (lVar12 != 0);
    }
    operator_delete__(&pSVar4[-1].allocated,lVar10 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }